

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::parse_value<double>
               (string *text,vector<double,_std::allocator<double>_> *value)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  bool local_1e2;
  double local_1d8;
  double v;
  undefined1 local_1c0 [8];
  string token;
  stringstream in;
  vector<double,_std::allocator<double>_> *value_local;
  string *text_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(token.field_2._M_local_buf + 8),(string *)text,_Var2);
  std::__cxx11::string::string((string *)local_1c0);
  while( true ) {
    bVar1 = std::ios::eof();
    local_1e2 = false;
    if ((bVar1 & 1) == 0) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(token.field_2._M_local_buf + 8),(string *)local_1c0,',');
      local_1e2 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    }
    if (local_1e2 == false) break;
    parse_value<double>((string *)local_1c0,&local_1d8);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(value,&local_1d8);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }